

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

int __thiscall
EdgeParameter::verify
          (EdgeParameter *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int in_EAX;
  imageException *this_00;
  
  if (this->groupFactor == 0) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Grouping factor for edge detection cannot be 0");
  }
  else if (this->skipFactor == 0) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Skip factor for edge detection cannot be 0");
  }
  else {
    if (this->minimumContrast != '\0') {
      return in_EAX;
    }
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Minimum contrast for edge detection cannot be 0");
  }
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void EdgeParameter::verify() const
{
    if ( groupFactor == 0u )
        throw imageException( "Grouping factor for edge detection cannot be 0" );
    if ( skipFactor == 0u )
        throw imageException( "Skip factor for edge detection cannot be 0" );
    if ( minimumContrast == 0u )
        throw imageException( "Minimum contrast for edge detection cannot be 0" );
}